

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_number.c
# Opt level: O0

int mpt_convert_number(char *src,int fmt,void *dest)

{
  char cVar1;
  ushort **ppuVar2;
  char *local_30;
  char *pos;
  void *dest_local;
  int fmt_local;
  char *src_local;
  
  if (src == (char *)0x0) {
    src_local._4_4_ = 0;
  }
  else {
    local_30 = src;
    if (fmt == 99) {
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*local_30] & 0x2000) != 0) {
        local_30 = local_30 + 1;
      }
      if (*local_30 == '\0') {
        src_local._4_4_ = 0;
      }
      else {
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)*local_30] & 0x8000) == 0) {
          src_local._4_4_ = -3;
        }
        else {
          if (dest != (void *)0x0) {
            *(char *)dest = *local_30;
          }
          src_local._4_4_ = ((int)local_30 + 1) - (int)src;
        }
      }
    }
    else {
      dest_local._4_4_ = fmt;
      if (fmt == 0x6c) {
        cVar1 = mpt_type_int(8);
        dest_local._4_4_ = (int)cVar1;
      }
      switch(dest_local._4_4_) {
      case 0x62:
        src_local._4_4_ = mpt_cint8((int8_t *)dest,src,0,(int8_t *)0x0);
        break;
      default:
        src_local._4_4_ = -3;
        break;
      case 100:
        src_local._4_4_ = mpt_cdouble((double *)dest,src,(double *)0x0);
        break;
      case 0x65:
        src_local._4_4_ = mpt_cldouble((longdouble *)dest,src,(longdouble *)0x0);
        break;
      case 0x66:
        src_local._4_4_ = mpt_cfloat((float *)dest,src,(float *)0x0);
        break;
      case 0x69:
        src_local._4_4_ = mpt_cint32((int32_t *)dest,src,0,(int32_t *)0x0);
        break;
      case 0x6c:
        src_local._4_4_ = mpt_cuint64((uint64_t *)dest,src,0x10,(uint64_t *)0x0);
        break;
      case 0x6e:
        src_local._4_4_ = mpt_cint16((int16_t *)dest,src,0,(int16_t *)0x0);
        break;
      case 0x71:
        src_local._4_4_ = mpt_cuint16((uint16_t *)dest,src,0,(uint16_t *)0x0);
        break;
      case 0x74:
        src_local._4_4_ = mpt_cuint64((uint64_t *)dest,src,0,(uint64_t *)0x0);
        break;
      case 0x75:
        src_local._4_4_ = mpt_cuint32((uint32_t *)dest,src,0,(uint32_t *)0x0);
        break;
      case 0x78:
        src_local._4_4_ = mpt_cuint64((uint64_t *)dest,src,0,(uint64_t *)0x0);
        break;
      case 0x79:
        src_local._4_4_ = mpt_cuint8((uint8_t *)dest,src,0,(uint8_t *)0x0);
      }
    }
  }
  return src_local._4_4_;
}

Assistant:

extern int mpt_convert_number(const char *src, int fmt, void *dest)
{
	if (!src) {
		return 0;
	}
	if (fmt == 'c') {
		const char *pos = src;
		while (isspace(*pos)) ++pos;
		if (!*pos) return 0;
		if (!isgraph(*pos)) return MPT_ERROR(BadType);
		if (dest) *((char *) dest) = *pos;
		return pos + 1 - src;
	}
	if (fmt == 'l') {
		fmt = mpt_type_int(sizeof(long));
	}
	switch (fmt) {
		case 'b': return mpt_cint8 (dest, src, 0, 0);
		case 'y': return mpt_cuint8(dest, src, 0, 0);
		
		case 'n': return mpt_cint16 (dest, src, 0, 0);
		case 'q': return mpt_cuint16(dest, src, 0, 0);
		
		case 'i': return mpt_cint32 (dest, src, 0, 0);
		case 'u': return mpt_cuint32(dest, src, 0, 0);
		
		case 'x': return mpt_cuint64(dest, src,  0, 0);
		case 't': return mpt_cuint64(dest, src,  0, 0);
		case 'l': return mpt_cuint64(dest, src, 16, 0);
		
		case 'f': return mpt_cfloat(dest, src, 0);
		case 'd': return mpt_cdouble(dest, src, 0);
		case 'e': return mpt_cldouble(dest, src, 0);
		
		default: return MPT_ERROR(BadType);
	}
}